

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001c0760 = 0x2d2d2d2d2d2d2d;
    uRam00000000001c0767 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001c0750 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001c0758 = 0x2d2d2d2d2d2d2d;
    DAT_001c075f = 0x2d;
    _DAT_001c0740 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001c0748 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001c0730 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001c0738 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001c0728 = 0x2d2d2d2d2d2d2d2d;
    DAT_001c076f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }